

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

void __thiscall QTabBar::setTabEnabled(QTabBar *this,int index,bool enabled)

{
  bool bVar1;
  QTabBarPrivate *this_00;
  Tab *pTVar2;
  undefined1 in_DL;
  int in_ESI;
  QWidget *in_RDI;
  QWidget *unaff_retaddr;
  Tab *tab;
  QTabBarPrivate *d;
  QTabBarPrivate *in_stack_ffffffffffffffe0;
  int index_00;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar3;
  QWidget *this_01;
  
  uVar3 = CONCAT13(in_DL,in_stack_fffffffffffffff0) & 0x1ffffff;
  this_01 = in_RDI;
  this_00 = d_func((QTabBar *)0x6addc7);
  pTVar2 = QTabBarPrivate::at(in_stack_ffffffffffffffe0,(int)((ulong)in_RDI >> 0x20));
  if (pTVar2 != (Tab *)0x0) {
    pTVar2->field_0xe4 = pTVar2->field_0xe4 & 0xfe | (byte)(uVar3 >> 0x18) & 1;
    QWidget::setShortcutEnabled
              (unaff_retaddr,(int)((ulong)this_01 >> 0x20),SUB81((ulong)this_01 >> 0x18,0));
    index_00 = (int)((ulong)pTVar2 >> 0x20);
    QWidget::update(in_RDI);
    if (((uVar3 & 0x1000000) == 0) && (in_ESI == this_00->currentIndex)) {
      QTabBarPrivate::selectNewCurrentIndexFrom
                ((QTabBarPrivate *)CONCAT44(in_ESI,uVar3),(int)((ulong)this_00 >> 0x20));
      setCurrentIndex((QTabBar *)this_01,in_ESI);
    }
    else if (((uVar3 & 0x1000000) != 0) &&
            (bVar1 = isTabVisible((QTabBar *)this_00,index_00), !bVar1)) {
      QTabBarPrivate::selectNewCurrentIndexFrom
                ((QTabBarPrivate *)CONCAT44(in_ESI,uVar3),(int)((ulong)this_00 >> 0x20));
      setCurrentIndex((QTabBar *)this_01,in_ESI);
    }
  }
  return;
}

Assistant:

void QTabBar::setTabEnabled(int index, bool enabled)
{
    Q_D(QTabBar);
    if (QTabBarPrivate::Tab *tab = d->at(index)) {
        tab->enabled = enabled;
#ifndef QT_NO_SHORTCUT
        setShortcutEnabled(tab->shortcutId, enabled);
#endif
        update();
        if (!enabled && index == d->currentIndex)
            setCurrentIndex(d->selectNewCurrentIndexFrom(index+1));
        else if (enabled && !isTabVisible(d->currentIndex))
            setCurrentIndex(d->selectNewCurrentIndexFrom(index));
    }
}